

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.h
# Opt level: O1

void PrintVersion(void)

{
  ostream *poVar1;
  char local_b [3];
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
  local_b[0] = '.';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_b,1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,2);
  local_b[1] = 0x2e;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_b + 1,1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,3);
  local_b[2] = 0x2e;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_b + 2,1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"b2eb09046af4bc17497a8555bdbf6c67da639aa7",0x28);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void PrintVersion()
{
    // to be overwritten by CMakeLists.txt
    std::cout << MAJOR << '.' << MINOR << '.' << PATCH << '.' << REVISION << " " << COMMIT << std::endl;
}